

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

Type * __thiscall
slang::ast::GenericClassDefSymbol::getSpecializationImpl
          (GenericClassDefSymbol *this,ASTContext *context,SourceLocation instanceLoc,
          bool forceInvalidParams,ParameterValueAssignmentSyntax *syntax)

{
  SymbolIndex SVar1;
  SymbolKind SVar2;
  Scope *pSVar3;
  Scope *pSVar4;
  size_type sVar5;
  ParameterSymbol *this_00;
  _func_void_intptr_t_Compilation_ptr_ClassType_ptr *p_Var6;
  span<const_slang::ast::Definition::ParameterDecl,_18446744073709551615UL> parameterDecls;
  ClassType *this_01;
  Compilation *dst;
  GenericClassDefSymbol *pGVar7;
  bool bVar8;
  int iVar9;
  ParameterSymbolBase *pPVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator iVar11;
  ClassDeclarationSyntax *syntax_00;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *pEVar12;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX_02;
  long lVar13;
  pointer decl;
  bool bVar14;
  span<const_slang::ConstantValue_*const,_18446744073709551615UL> paramValues_00;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> typeParams_00;
  SourceRange referencingRange;
  ClassType *classType;
  SpecializationKey key;
  SmallVector<const_slang::ast::Type_*,_5UL> typeParams;
  SmallVector<const_slang::ConstantValue_*,_5UL> paramValues;
  ParameterBuilder paramBuilder;
  ClassType *local_280;
  ClassType *local_278;
  Compilation *local_270;
  ParameterValueAssignmentSyntax *local_268;
  GenericClassDefSymbol *local_260;
  Scope *local_258;
  SpecializationKey local_250;
  SmallVectorBase<const_slang::ast::Type_*> local_220 [2];
  SmallVectorBase<const_slang::ConstantValue_*> local_1e0 [2];
  ParameterBuilder local_1a0;
  
  pSVar3 = (context->scope).ptr;
  local_268 = syntax;
  if (pSVar3 != (Scope *)0x0) {
    pSVar4 = (this->super_Symbol).parentScope;
    if (pSVar4 == (Scope *)0x0) {
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/ClassSymbols.cpp"
                 ,0x307,
                 "const Type *slang::ast::GenericClassDefSymbol::getSpecializationImpl(const ASTContext &, SourceLocation, bool, const ParameterValueAssignmentSyntax *) const"
                );
    }
    local_270 = pSVar3->compilation;
    local_278 = BumpAllocator::
                emplace<slang::ast::ClassType,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&>
                          (&local_270->super_BumpAllocator,local_270,&(this->super_Symbol).name,
                           &(this->super_Symbol).location);
    local_278->genericClass = this;
    SVar1 = (this->super_Symbol).indexInScope;
    (local_278->super_Type).super_Symbol.parentScope = pSVar4;
    (local_278->super_Type).super_Symbol.indexInScope = SVar1;
    pSVar3 = (context->scope).ptr;
    if (pSVar3 != (Scope *)0x0) {
      parameterDecls.data_ =
           (this->paramDecls).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.data_;
      parameterDecls.size_ =
           (this->paramDecls).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.len;
      local_258 = pSVar4;
      ParameterBuilder::ParameterBuilder(&local_1a0,pSVar3,(this->super_Symbol).name,parameterDecls)
      ;
      local_1a0.suppressErrors = local_268 == (ParameterValueAssignmentSyntax *)0x0;
      local_1a0.instanceContext = context;
      local_1a0.forceInvalidValues = forceInvalidParams;
      if (!local_1a0.suppressErrors) {
        ParameterBuilder::setAssignments(&local_1a0,local_268);
      }
      local_1e0[0].data_ = (pointer)local_1e0[0].firstElement;
      local_1e0[0].len = 0;
      local_1e0[0].cap = 5;
      pEVar12 = (EVP_PKEY_CTX *)local_220[0].firstElement;
      local_220[0].len = 0;
      local_220[0].cap = 5;
      sVar5 = (this->paramDecls).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.len;
      bVar14 = sVar5 == 0;
      local_260 = this;
      local_220[0].data_ = (pointer)pEVar12;
      if (!bVar14) {
        decl = (this->paramDecls).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.data_
        ;
        lVar13 = sVar5 * 0x30;
        do {
          pPVar10 = ParameterBuilder::createParam
                              (&local_1a0,decl,&local_278->super_Scope,instanceLoc);
          bVar8 = local_1a0.anyErrors;
          pEVar12 = extraout_RDX;
          if (local_1a0.anyErrors == true) {
            if (local_268 == (ParameterValueAssignmentSyntax *)0x0) {
              local_280 = (ClassType *)0x0;
            }
            else {
              local_280 = (ClassType *)local_270->errorType;
            }
          }
          else if (pPVar10->isLocal == false) {
            this_00 = (ParameterSymbol *)pPVar10->symbol;
            SVar2 = (this_00->super_ValueSymbol).super_Symbol.kind;
            if (SVar2 == TypeParameter) {
              local_250.definition =
                   (GenericClassDefSymbol *)
                   DeclaredType::getType
                             ((DeclaredType *)&(this_00->super_ValueSymbol).declaredType.typeOrLink)
              ;
              SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
                        ((SmallVectorBase<slang::ast::Type_const*> *)local_220,(Type **)&local_250);
              pEVar12 = extraout_RDX_01;
            }
            else {
              if (SVar2 != Parameter) {
                assert::assertFailed
                          ("T::isKind(kind)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                           ,0xc4,
                           "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::TypeParameterSymbol]"
                          );
              }
              referencingRange.endLoc =
                   (SourceLocation)
                   ((long)instanceLoc * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
                   (ulong)(instanceLoc._0_4_ & 0xfffffff));
              referencingRange.startLoc = instanceLoc;
              local_250.definition =
                   (GenericClassDefSymbol *)ParameterSymbol::getValue(this_00,referencingRange);
              SmallVectorBase<slang::ConstantValue_const*>::
              emplace_back<slang::ConstantValue_const*>
                        ((SmallVectorBase<slang::ConstantValue_const*> *)local_1e0,
                         (ConstantValue **)&local_250);
              pEVar12 = extraout_RDX_00;
            }
          }
          if (bVar8 != false) break;
          decl = decl + 1;
          lVar13 = lVar13 + -0x30;
          bVar14 = lVar13 == 0;
        } while (!bVar14);
      }
      dst = local_270;
      if (bVar14) {
        iVar9 = SmallVectorBase<const_slang::ConstantValue_*>::copy
                          (local_1e0,(EVP_PKEY_CTX *)local_270,pEVar12);
        paramValues_00.data_._4_4_ = extraout_var;
        paramValues_00.data_._0_4_ = iVar9;
        iVar9 = SmallVectorBase<const_slang::ast::Type_*>::copy(local_220,(EVP_PKEY_CTX *)dst,src);
        pSVar3 = local_258;
        pGVar7 = local_260;
        typeParams_00.data_._4_4_ = extraout_var_00;
        typeParams_00.data_._0_4_ = iVar9;
        paramValues_00.size_ = (size_type)src;
        typeParams_00.size_ = extraout_RDX_02;
        SpecializationKey::SpecializationKey(&local_250,local_260,paramValues_00,typeParams_00);
        iVar11 = ska::detailv3::
                 sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
                 ::find(&(pGVar7->specMap).
                         super_sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
                        ,&local_250);
        this_01 = local_278;
        if (iVar11.current ==
            (pGVar7->specMap).
            super_sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
            .entries +
            (pGVar7->specMap).
            super_sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
            .num_slots_minus_one +
            (long)(pGVar7->specMap).
                  super_sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
                  .max_lookups) {
          p_Var6 = (pGVar7->specializeFunc).callback;
          if (p_Var6 == (_func_void_intptr_t_Compilation_ptr_ClassType_ptr *)0x0) {
            syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::ClassDeclarationSyntax>
                                  ((pGVar7->super_Symbol).originatingSyntax);
            ClassType::populate(this_01,pSVar3,syntax_00);
          }
          else {
            (*p_Var6)((pGVar7->specializeFunc).callable,dst,local_278);
          }
          ska::detailv3::
          sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::GenericClassDefSymbol::Hasher,ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::Hasher>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>>,std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>>>
          ::emplace<slang::ast::GenericClassDefSymbol::SpecializationKey&,slang::ast::ClassType*&>
                    ((sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::GenericClassDefSymbol::Hasher,ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::Hasher>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>>,std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>>>
                      *)&pGVar7->specMap,&local_250,&local_278);
          local_280 = local_278;
        }
        else {
          local_280 = (ClassType *)((iVar11.current)->field_1).value.second;
        }
      }
      if (local_220[0].data_ != (pointer)local_220[0].firstElement) {
        free(local_220[0].data_);
      }
      if (local_1e0[0].data_ != (pointer)local_1e0[0].firstElement) {
        free(local_1e0[0].data_);
      }
      ska::detailv3::
      sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
      ::~sherwood_v3_table
                (&local_1a0.assignments.
                  super_flat_hash_map<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
                  .
                  super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
                );
      return &local_280->super_Type;
    }
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
            );
}

Assistant:

const Type* GenericClassDefSymbol::getSpecializationImpl(
    const ASTContext& context, SourceLocation instanceLoc, bool forceInvalidParams,
    const ParameterValueAssignmentSyntax* syntax) const {

    auto& comp = context.getCompilation();
    auto scope = getParentScope();
    ASSERT(scope);

    // Create a class type instance to hold the parameters. If it turns out we already
    // have this specialization cached we'll throw it away, but that's not a big deal.
    auto classType = comp.emplace<ClassType>(comp, name, location);
    classType->genericClass = this;
    classType->setParent(*scope, getIndex());

    // If this is for the default specialization, `syntax` will be null.
    // We want to suppress errors about params not having values and just
    // return null so that the caller can figure out if this is actually a problem.
    bool isForDefault = syntax == nullptr;

    ParameterBuilder paramBuilder(*context.scope, name, paramDecls);
    paramBuilder.setForceInvalidValues(forceInvalidParams);
    paramBuilder.setSuppressErrors(isForDefault);
    paramBuilder.setInstanceContext(context);
    if (syntax)
        paramBuilder.setAssignments(*syntax);

    SourceRange instRange = {instanceLoc, instanceLoc + 1};

    SmallVector<const ConstantValue*> paramValues;
    SmallVector<const Type*> typeParams;
    for (auto& decl : paramDecls) {
        auto& param = paramBuilder.createParam(decl, *classType, instanceLoc);
        if (paramBuilder.hasErrors()) {
            if (isForDefault)
                return nullptr;

            // Otherwise use an error type instead.
            return &comp.getErrorType();
        }

        if (!param.isLocalParam()) {
            auto& sym = param.symbol;
            if (sym.kind == SymbolKind::Parameter) {
                auto& ps = sym.as<ParameterSymbol>();
                paramValues.push_back(&ps.getValue(instRange));
            }
            else {
                auto& tps = sym.as<TypeParameterSymbol>();
                typeParams.push_back(&tps.targetType.getType());
            }
        }
    }

    SpecializationKey key(*this, paramValues.copy(comp), typeParams.copy(comp));
    if (auto it = specMap.find(key); it != specMap.end())
        return it->second;

    // Not found, so this is a new entry. Fill in its members and store the
    // specialization for later lookup. If we have a specialization function,
    // call that instead of trying to create from our syntax node.
    if (specializeFunc)
        specializeFunc(comp, *classType);
    else
        classType->populate(*scope, getSyntax()->as<ClassDeclarationSyntax>());
    specMap.emplace(key, classType);
    return classType;
}